

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::ScopedFakeTestPartResultReporter::Init(ScopedFakeTestPartResultReporter *this)

{
  ulong uVar1;
  UnitTestImpl *pUVar2;
  
  UnitTest::GetInstance();
  pUVar2 = UnitTest::GetInstance::instance.impl_;
  uVar1 = (ulong)(this->intercept_mode_ != INTERCEPT_ALL_THREADS);
  this->old_reporter_ =
       (&(UnitTest::GetInstance::instance.impl_)->global_test_part_result_repoter_)[uVar1 * 2];
  (&pUVar2->global_test_part_result_repoter_)[uVar1 * 2] =
       &this->super_TestPartResultReporterInterface;
  return;
}

Assistant:

void ScopedFakeTestPartResultReporter::Init() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  if (intercept_mode_ == INTERCEPT_ALL_THREADS) {
    old_reporter_ = impl->GetGlobalTestPartResultReporter();
    impl->SetGlobalTestPartResultReporter(this);
  } else {
    old_reporter_ = impl->GetTestPartResultReporterForCurrentThread();
    impl->SetTestPartResultReporterForCurrentThread(this);
  }
}